

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall timer::notify(timer *this,time_point now)

{
  bool bVar1;
  pointer ppVar2;
  exception *e;
  _Rb_tree_const_iterator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>
  local_20;
  iterator i;
  timer *this_local;
  time_point now_local;
  
  i._M_node = (_Base_ptr)this;
  this_local = (timer *)now.__d.__r;
  while( true ) {
    bVar1 = std::
            set<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
            ::empty(&this->queue);
    if (bVar1) {
      return;
    }
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
         ::begin(&this->queue);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>
             ::operator->(&local_20);
    bVar1 = std::chrono::operator>
                      (&ppVar2->first,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local);
    if (bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>
             ::operator->(&local_20);
    ppVar2->second->t = (timer *)0x0;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>
             ::operator->(&local_20);
    std::function<void_()>::operator()(&ppVar2->second->callback);
    std::
    set<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>>
    ::erase_abi_cxx11_((set<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>,std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,timer_element*>>>
                        *)this,(const_iterator)local_20._M_node);
  }
  return;
}

Assistant:

void timer::notify(clock_t::time_point now)
{
    for (;;)
    {
        if (queue.empty())
            break;

        auto i = queue.begin();
        if (i->first > now)
            break;

        i->second->t = nullptr;
        try
        {
            i->second->callback();
        }
        catch (std::exception const& e)
        {
            std::cerr << "error: " << e.what() << std::endl;
        }
        catch (...)
        {
            std::cerr << "unknown exception in timer::notify()" << std::endl;
        }

        queue.erase(i);
    }
}